

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O3

void absl::anon_unknown_2::DivModImpl
               (uint128 dividend,uint128 divisor,uint128 *quotient_ret,uint128 *remainder_ret)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  uint64_t hi_1;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint64_t uVar16;
  
  uVar6 = divisor.hi_;
  uVar9 = divisor.lo_;
  uVar12 = dividend.hi_;
  uVar13 = dividend.lo_;
  if (uVar9 == 0 && uVar6 == 0) {
    __assert_fail("divisor != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/numeric/int128.cc"
                  ,0x3a,
                  "void absl::(anonymous namespace)::DivModImpl(uint128, uint128, uint128 *, uint128 *)"
                 );
  }
  if (uVar12 < uVar6 || uVar12 - uVar6 < (ulong)(uVar13 < uVar9)) {
    quotient_ret->lo_ = 0;
    quotient_ret->hi_ = 0;
  }
  else {
    if (uVar6 == uVar12 && uVar9 == uVar13) {
      quotient_ret->lo_ = 1;
      quotient_ret->hi_ = 0;
      remainder_ret->lo_ = 0;
      remainder_ret->hi_ = 0;
      return;
    }
    uVar7 = 0x7f;
    uVar15 = 0x7f;
    uVar14 = uVar12;
    if (((uVar12 == 0) && (uVar15 = 0x3f, uVar14 = uVar13, uVar13 == 0)) ||
       ((uVar11 = uVar6, uVar6 == 0 && (uVar7 = 0x3f, uVar11 = uVar9, uVar9 == 0)))) {
      __assert_fail("low != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/numeric/int128.cc"
                    ,0x31,"int absl::(anonymous namespace)::Fls128(uint128)");
    }
    lVar2 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    lVar3 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    uVar7 = ((uint)lVar2 ^ uVar15 ^ 0x3f) - ((uint)lVar3 ^ uVar7 ^ 0x3f);
    if ((int)uVar7 < 0) {
      uVar16 = 0;
      uVar14 = 0;
    }
    else {
      bVar4 = (byte)uVar7 & 0x3f;
      uVar10 = uVar9 << ((byte)uVar7 & 0x3f);
      uVar14 = 0;
      uVar11 = uVar10;
      uVar6 = uVar6 << bVar4 | uVar9 >> 0x40 - bVar4;
      if ((uVar7 & 0x40) != 0) {
        uVar11 = uVar14;
        uVar6 = uVar10;
      }
      iVar8 = uVar7 + 1;
      uVar16 = 0;
      uVar9 = uVar12;
      do {
        uVar14 = uVar14 << 1 | uVar16 >> 0x3f;
        uVar10 = (ulong)(uVar13 < uVar11);
        uVar1 = uVar9 - uVar6;
        uVar16 = (ulong)(uVar6 <= uVar9 && uVar10 <= uVar1) + uVar16 * 2;
        uVar12 = uVar1 - uVar10;
        uVar5 = uVar13 - uVar11;
        if (uVar6 > uVar9 || uVar10 > uVar1) {
          uVar12 = uVar9;
          uVar5 = uVar13;
        }
        uVar13 = uVar5;
        uVar11 = uVar11 >> 1 | uVar6 << 0x3f;
        uVar6 = uVar6 >> 1;
        iVar8 = iVar8 + -1;
        uVar9 = uVar12;
      } while (iVar8 != 0);
    }
    quotient_ret->lo_ = uVar16;
    quotient_ret->hi_ = uVar14;
  }
  remainder_ret->lo_ = uVar13;
  remainder_ret->hi_ = uVar12;
  return;
}

Assistant:

inline void DivModImpl(uint128 dividend, uint128 divisor, uint128* quotient_ret,
                       uint128* remainder_ret) {
  assert(divisor != 0);

  if (divisor > dividend) {
    *quotient_ret = 0;
    *remainder_ret = dividend;
    return;
  }

  if (divisor == dividend) {
    *quotient_ret = 1;
    *remainder_ret = 0;
    return;
  }

  uint128 denominator = divisor;
  uint128 quotient = 0;

  // Left aligns the MSB of the denominator and the dividend.
  const int shift = Fls128(dividend) - Fls128(denominator);
  denominator <<= shift;

  // Uses shift-subtract algorithm to divide dividend by denominator. The
  // remainder will be left in dividend.
  for (int i = 0; i <= shift; ++i) {
    quotient <<= 1;
    if (dividend >= denominator) {
      dividend -= denominator;
      quotient |= 1;
    }
    denominator >>= 1;
  }

  *quotient_ret = quotient;
  *remainder_ret = dividend;
}